

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

SmallVectorImpl<llvm::DWARFDebugMacro::Entry> * __thiscall
llvm::SmallVectorImpl<llvm::DWARFDebugMacro::Entry>::operator=
          (SmallVectorImpl<llvm::DWARFDebugMacro::Entry> *this,
          SmallVectorImpl<llvm::DWARFDebugMacro::Entry> *RHS)

{
  iterator MinSize;
  const_iterator pEVar1;
  const_iterator pEVar2;
  iterator pEVar3;
  iterator pEVar4;
  iterator pEVar5;
  Entry *local_38;
  iterator NewEnd;
  size_t CurSize;
  size_t RHSSize;
  SmallVectorImpl<llvm::DWARFDebugMacro::Entry> *RHS_local;
  SmallVectorImpl<llvm::DWARFDebugMacro::Entry> *this_local;
  
  if (this != RHS) {
    MinSize = (iterator)SmallVectorBase::size((SmallVectorBase *)RHS);
    NewEnd = (iterator)SmallVectorBase::size((SmallVectorBase *)this);
    if (NewEnd < MinSize) {
      pEVar4 = (iterator)SmallVectorBase::capacity((SmallVectorBase *)this);
      if (pEVar4 < MinSize) {
        pEVar3 = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)this);
        pEVar5 = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::end
                           ((SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)this);
        SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>::destroy_range(pEVar3,pEVar5);
        SmallVectorBase::set_size((SmallVectorBase *)this,0);
        NewEnd = (iterator)0x0;
        SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>::grow
                  (&this->super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>,
                   (size_t)MinSize);
      }
      else if (NewEnd != (iterator)0x0) {
        pEVar1 = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)RHS);
        pEVar2 = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)RHS);
        pEVar3 = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)this);
        std::copy<llvm::DWARFDebugMacro::Entry_const*,llvm::DWARFDebugMacro::Entry*>
                  (pEVar1,pEVar2 + (long)NewEnd,pEVar3);
      }
      pEVar1 = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::begin
                         ((SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)RHS);
      pEVar2 = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::end
                         ((SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)RHS);
      pEVar3 = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::begin
                         ((SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)this);
      SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,true>::
      uninitialized_copy<llvm::DWARFDebugMacro::Entry_const,llvm::DWARFDebugMacro::Entry>
                (pEVar1 + (long)NewEnd,pEVar2,pEVar3 + (long)NewEnd,(type *)0x0);
      SmallVectorBase::set_size((SmallVectorBase *)this,(size_t)MinSize);
    }
    else {
      if (MinSize == (iterator)0x0) {
        local_38 = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::begin
                             ((SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)this)
        ;
      }
      else {
        pEVar1 = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)RHS);
        pEVar2 = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)RHS);
        pEVar3 = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::begin
                           ((SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)this);
        local_38 = std::copy<llvm::DWARFDebugMacro::Entry_const*,llvm::DWARFDebugMacro::Entry*>
                             (pEVar1,pEVar2 + (long)MinSize,pEVar3);
      }
      pEVar3 = SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>::end
                         ((SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void> *)this);
      SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>::destroy_range(local_38,pEVar3);
      SmallVectorBase::set_size((SmallVectorBase *)this,(size_t)MinSize);
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->set_size(RHSSize);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->set_size(0);
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->set_size(RHSSize);
  return *this;
}